

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# command_parser.cpp
# Opt level: O0

CommandPacket CommandParser::checkForCommands(DebugInterface *serialLog,NetInterface *wifi)

{
  CommandPacket CVar1;
  byte bVar2;
  bool bVar3;
  int iVar4;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __first;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __last;
  __normal_iterator<char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  __result;
  WifiDebugOstream *pWVar5;
  reference pCVar6;
  long lVar7;
  CommandTemplate *ct;
  const_iterator __end1;
  const_iterator __begin1;
  vector<CommandParser::CommandTemplate,_std::allocator<CommandParser::CommandTemplate>_> *__range1;
  undefined1 local_38 [7];
  bool dataReady;
  WifiDebugOstream log;
  NetInterface *wifi_local;
  DebugInterface *serialLog_local;
  CommandPacket result;
  
  log._16_8_ = wifi;
  CommandPacket::CommandPacket((CommandPacket *)&serialLog_local);
  WifiDebugOstream::WifiDebugOstream
            ((WifiDebugOstream *)local_38,serialLog,(NetInterface *)log._16_8_);
  if ((checkForCommands(DebugInterface&,NetInterface&)::command_abi_cxx11_ == '\0') &&
     (iVar4 = __cxa_guard_acquire(&checkForCommands(DebugInterface&,NetInterface&)::
                                   command_abi_cxx11_), iVar4 != 0)) {
    std::__cxx11::string::string
              ((string *)checkForCommands(DebugInterface&,NetInterface&)::command_abi_cxx11_);
    __cxa_atexit(std::__cxx11::string::~string,
                 checkForCommands(DebugInterface&,NetInterface&)::command_abi_cxx11_,&__dso_handle);
    __cxa_guard_release(&checkForCommands(DebugInterface&,NetInterface&)::command_abi_cxx11_);
  }
  bVar2 = (**(code **)(*(long *)log._16_8_ + 0x18))
                    (log._16_8_,local_38,
                     checkForCommands(DebugInterface&,NetInterface&)::command_abi_cxx11_);
  if ((bVar2 & 1) != 0) {
    __first._M_current = (char *)std::__cxx11::string::begin();
    __last._M_current = (char *)std::__cxx11::string::end();
    __result._M_current = (char *)std::__cxx11::string::begin();
    std::
    transform<__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char*,std::__cxx11::string>,int(*)(int)>
              (__first,__last,__result,tolower);
    pWVar5 = operator<<((WifiDebugOstream *)local_38,"Got: ");
    pWVar5 = operator<<(pWVar5,(string *)
                               checkForCommands(DebugInterface&,NetInterface&)::command_abi_cxx11_);
    operator<<(pWVar5,"\n");
    __end1 = std::
             vector<CommandParser::CommandTemplate,_std::allocator<CommandParser::CommandTemplate>_>
             ::begin((vector<CommandParser::CommandTemplate,_std::allocator<CommandParser::CommandTemplate>_>
                      *)commandTemplates);
    ct = (CommandTemplate *)
         std::
         vector<CommandParser::CommandTemplate,_std::allocator<CommandParser::CommandTemplate>_>::
         end((vector<CommandParser::CommandTemplate,_std::allocator<CommandParser::CommandTemplate>_>
              *)commandTemplates);
    while (bVar3 = __gnu_cxx::operator!=
                             (&__end1,(__normal_iterator<const_CommandParser::CommandTemplate_*,_std::vector<CommandParser::CommandTemplate,_std::allocator<CommandParser::CommandTemplate>_>_>
                                       *)&ct), bVar3) {
      pCVar6 = __gnu_cxx::
               __normal_iterator<const_CommandParser::CommandTemplate_*,_std::vector<CommandParser::CommandTemplate,_std::allocator<CommandParser::CommandTemplate>_>_>
               ::operator*(&__end1);
      lVar7 = std::__cxx11::string::find
                        ((string *)
                         checkForCommands(DebugInterface&,NetInterface&)::command_abi_cxx11_,
                         (ulong)pCVar6);
      if (lVar7 == 0) {
        serialLog_local._0_4_ = pCVar6->outputCommand;
        if (pCVar6->hasArg == Yes) {
          lVar7 = std::__cxx11::string::length();
          serialLog_local._4_4_ =
               process_int((string *)
                           checkForCommands(DebugInterface&,NetInterface&)::command_abi_cxx11_,
                           lVar7 + 1);
        }
        break;
      }
      __gnu_cxx::
      __normal_iterator<const_CommandParser::CommandTemplate_*,_std::vector<CommandParser::CommandTemplate,_std::allocator<CommandParser::CommandTemplate>_>_>
      ::operator++(&__end1);
    }
  }
  CVar1.optionalArg = serialLog_local._4_4_;
  CVar1.command = (Command)serialLog_local;
  return CVar1;
}

Assistant:

const CommandPacket checkForCommands( 
	DebugInterface& serialLog, 
	NetInterface& wifi  )
{
	CommandPacket result;
  
  WifiDebugOstream log( &serialLog, &wifi );

  // Read the first line of the request.  

  static std::string command;
  bool dataReady = wifi.getString( log, command );
  if ( !dataReady )
  {
    return result;
  }

  std::transform( command.begin(), command.end(), command.begin(), ::tolower);

  log << "Got: " << command << "\n";

  for ( const CommandTemplate& ct : commandTemplates )
  {
    if ( command.find(ct.inputCommand ) == 0 )
    {
      result.command = ct.outputCommand;
      if ( ct.hasArg == HasArg::Yes )
      {
        result.optionalArg =  process_int( command,  ct.inputCommand.length()+1  );
      } 
      return result;
    }
  } 
  return result;

}